

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.cpp
# Opt level: O0

void __thiscall Mond::Visitor::Visit(Visitor *this,StmtVarDecl *stmt)

{
  bool bVar1;
  __shared_ptr<Mond::Expr,_(__gnu_cxx::_Lock_policy)2> *this_00;
  AstNode *n;
  shared_ptr<Mond::Expr> *value;
  iterator __end1;
  iterator __begin1;
  ExprPtrList *__range1;
  StmtVarDecl *stmt_local;
  Visitor *this_local;
  
  VisitSelf<Mond::StmtVarDecl*>(this,stmt);
  __end1 = std::vector<std::shared_ptr<Mond::Expr>,_std::allocator<std::shared_ptr<Mond::Expr>_>_>::
           begin(&stmt->values);
  value = (shared_ptr<Mond::Expr> *)
          std::vector<std::shared_ptr<Mond::Expr>,_std::allocator<std::shared_ptr<Mond::Expr>_>_>::
          end(&stmt->values);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<Mond::Expr>_*,_std::vector<std::shared_ptr<Mond::Expr>,_std::allocator<std::shared_ptr<Mond::Expr>_>_>_>
                                *)&value);
    if (!bVar1) break;
    this_00 = &__gnu_cxx::
               __normal_iterator<std::shared_ptr<Mond::Expr>_*,_std::vector<std::shared_ptr<Mond::Expr>,_std::allocator<std::shared_ptr<Mond::Expr>_>_>_>
               ::operator*(&__end1)->super___shared_ptr<Mond::Expr,_(__gnu_cxx::_Lock_policy)2>;
    n = &std::__shared_ptr<Mond::Expr,_(__gnu_cxx::_Lock_policy)2>::get(this_00)->super_AstNode;
    AcceptChild(this,n);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Mond::Expr>_*,_std::vector<std::shared_ptr<Mond::Expr>,_std::allocator<std::shared_ptr<Mond::Expr>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void Visitor::Visit(StmtVarDecl *stmt)
{
	VisitSelf(this, stmt);

	for (auto &value : stmt->values)
	{
		AcceptChild(this, value.get());
	}
}